

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O1

wchar_t do_shape(bidi_char *line,bidi_char *to,wchar_t count)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  wchar_t wVar4;
  ulong uVar5;
  uint *puVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  undefined *puVar10;
  long lVar11;
  char cVar12;
  bool bVar13;
  
  if (L'\0' < count) {
    uVar2 = (ulong)(uint)count;
    puVar6 = &line[-1].wc;
    bVar7 = false;
    uVar3 = 1;
    do {
      iVar1 = puVar6[4];
      to->index = (short)iVar1;
      to->nchars = (short)((uint)iVar1 >> 0x10);
      iVar1 = (puVar6 + 2)[1];
      to->origwc = (puVar6 + 2)[0];
      to->wc = iVar1;
      uVar9 = puVar6[3] - 0x621;
      uVar5 = (ulong)uVar9;
      cVar12 = '\x03';
      if (uVar9 < 0xb2) {
        cVar12 = shapetypes[uVar5].type;
      }
      if (cVar12 == '\x02') {
        uVar9 = 3;
        if ((uVar3 < uVar2) && (puVar6[6] - 0x621 < 0xb2)) {
          uVar9 = (uint)shapetypes[puVar6[6] - 0x621].type;
        }
        if (puVar6[3] != 0x644) {
LAB_001020f6:
          if ((uVar9 < 5) && ((0x15U >> (uVar9 & 0x1f) & 1) != 0)) {
            uVar9 = 3;
            if ((uVar3 != 1) && (*puVar6 - 0x621 < 0xb2)) {
              uVar9 = (uint)shapetypes[*puVar6 - 0x621].type;
            }
            if ((4 < uVar9) || ((0x16U >> (uVar9 & 0x1f) & 1) == 0)) {
              uVar5 = (ulong)(puVar6[3] - 0x621);
              goto LAB_0010204a;
            }
            wVar4 = shapetypes[puVar6[3] - 0x621].form_b + L'\x03';
          }
          else {
            uVar9 = 3;
            if ((uVar3 != 1) && (*puVar6 - 0x621 < 0xb2)) {
              uVar9 = (uint)shapetypes[*puVar6 - 0x621].type;
            }
            if ((4 < uVar9) || ((0x16U >> (uVar9 & 0x1f) & 1) == 0)) {
              uVar5 = (ulong)(puVar6[3] - 0x621);
              goto LAB_001021a5;
            }
            wVar4 = shapetypes[puVar6[3] - 0x621].form_b + L'\x02';
          }
          goto LAB_001021aa;
        }
        if (uVar3 != 1) {
          switch(*puVar6) {
          case 0x622:
            uVar8 = 0xfef5;
            puVar10 = &DAT_00109ac0;
            break;
          case 0x623:
            uVar8 = 0xfef7;
            puVar10 = &DAT_00109ad4;
            break;
          default:
            goto switchD_0010209b_caseD_624;
          case 0x625:
            uVar8 = 0xfef9;
            puVar10 = &DAT_00109ae8;
            break;
          case 0x627:
            uVar8 = 0xfefb;
            puVar10 = &DAT_00109afc;
          }
          if (uVar9 < 5) {
            uVar8 = *(uint *)(puVar10 + (long)(int)uVar9 * 4);
          }
          to->wc = uVar8;
          bVar7 = true;
        }
switchD_0010209b_caseD_624:
        if (!bVar7) goto LAB_001020f6;
        wVar4 = L' ';
        lVar11 = -8;
        bVar7 = false;
LAB_001021b0:
        *(wchar_t *)((long)&to->origwc + lVar11) = wVar4;
      }
      else if (cVar12 == '\x01') {
        uVar9 = 3;
        if ((uVar3 < uVar2) && (puVar6[6] - 0x621 < 0xb2)) {
          uVar9 = (uint)shapetypes[puVar6[6] - 0x621].type;
        }
        if ((uVar9 < 5) && ((0x15U >> (uVar9 & 0x1f) & 1) != 0)) {
LAB_0010204a:
          wVar4 = shapetypes[uVar5].form_b + L'\x01';
        }
        else {
LAB_001021a5:
          wVar4 = shapetypes[uVar5].form_b;
        }
LAB_001021aa:
        lVar11 = 4;
        goto LAB_001021b0;
      }
      puVar6 = puVar6 + 3;
      to = to + 1;
      bVar13 = uVar3 != uVar2;
      uVar3 = uVar3 + 1;
    } while (bVar13);
  }
  return L'\x01';
}

Assistant:

int do_shape(bidi_char *line, bidi_char *to, int count)
{
    int i, tempShape;
    bool ligFlag = false;

    for (i=0; i<count; i++) {
        to[i] = line[i];
        tempShape = STYPE(line[i].wc);
        switch (tempShape) {
          case SC:
            break;

          case SU:
            break;

          case SR:
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SFINAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


          case SD:
            /* Make Ligatures */
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if (line[i].wc == 0x644) {
                if (i > 0) switch (line[i-1].wc) {
                  case 0x622:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF6;
                    else
                        to[i].wc = 0xFEF5;
                    break;
                  case 0x623:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF8;
                    else
                        to[i].wc = 0xFEF7;
                    break;
                  case 0x625:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFA;
                    else
                        to[i].wc = 0xFEF9;
                    break;
                  case 0x627:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFC;
                    else
                        to[i].wc = 0xFEFB;
                    break;
                }
                if (ligFlag) {
                    to[i-1].wc = 0x20;
                    ligFlag = false;
                    break;
                }
            }

            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC)) {
                tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
                if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                    to[i].wc = SMEDIAL((SISOLATED(line[i].wc)));
                else
                    to[i].wc = SFINAL((SISOLATED(line[i].wc)));
                break;
            }

            tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
            if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SINITIAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


        }
    }
    return 1;
}